

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void format::format_details::
     variadic_switch<format::format_details::generic_format_value<std::__cxx11::string>,char_const(&)[6],char_const(&)[6]>
               (size_t index,
               generic_format_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *pred,char (*arg) [6],char (*args) [6])

{
  char (*args_local) [6];
  char (*arg_local) [6];
  generic_format_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pred_local;
  size_t index_local;
  
  if (index == 0) {
    generic_format_value<std::__cxx11::string>::operator()
              ((generic_format_value<std::__cxx11::string> *)pred,arg);
  }
  else {
    variadic_switch<format::format_details::generic_format_value<std::__cxx11::string>,char_const(&)[6]>
              (index - 1,pred,args);
  }
  return;
}

Assistant:

void variadic_switch(const std::size_t index,
                         Pred&& pred,
                         Arg&& arg,
                         Args&& ... args) {
      if (index == 0) {
        pred(std::forward<Arg>(arg));
      }
      else {
        variadic_switch(index-1,
                        std::forward<Pred>(pred),
                        std::forward<Args>(args)...);
      }
    }